

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_CallConstructorInternal
                  (JSContext *ctx,JSValue func_obj,JSValue new_target,int argc,JSValue *argv,
                  int flags)

{
  JSClassCall *pJVar1;
  JSValue new_target_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar2;
  JSValue JVar3;
  JSValue func_obj_00;
  JSValue func_obj_01;
  undefined1 auVar4 [16];
  int iVar5;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int64_t in_R8;
  int in_R9D;
  JSValue JVar6;
  JSValue JVar7;
  JSValue *in_stack_00000008;
  uint in_stack_00000010;
  JSValue ret;
  JSValue obj;
  JSClassCall *call_func;
  JSFunctionBytecode *b;
  JSObject *p;
  JSContext *in_stack_ffffffffffffff28;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uStack_6c;
  int in_stack_ffffffffffffff9c;
  JSContext *in_stack_ffffffffffffffa0;
  JSValueUnion local_18;
  int64_t local_10;
  
  iVar5 = js_poll_interrupts(in_stack_ffffffffffffff28);
  if (iVar5 != 0) {
    local_18.ptr = (void *)(local_18 << 0x20);
    local_10 = 6;
    return _local_18;
  }
  in_stack_00000010 = in_stack_00000010 | 1;
  if ((int)in_RDX == -1) {
    if ((*(byte *)((long)in_RSI.ptr + 5) >> 4 & 1) == 0) {
      JVar6 = JS_ThrowTypeError(in_RDI,"not a constructor");
      return JVar6;
    }
    if (*(short *)((long)in_RSI.ptr + 6) == 0xd) {
      uVar8 = (undefined4)in_R8;
      uVar9 = (undefined4)((ulong)in_R8 >> 0x20);
      if ((*(ushort *)((long)((JSValueUnion *)((long)in_RSI.ptr + 0x30))->ptr + 0x19) >> 2 & 1) != 0
         ) {
        func_obj_00.tag = in_RDX;
        func_obj_00.u.ptr = in_RSI.ptr;
        auVar4._4_4_ = 3;
        auVar4._0_4_ = uStack_6c;
        auVar4._8_8_ = 0;
        new_target_00.tag._0_4_ = uVar8;
        new_target_00.u.ptr = in_RCX.ptr;
        new_target_00.tag._4_4_ = uVar9;
        JVar6 = JS_CallInternal(in_RDI,func_obj_00,(JSValue)(auVar4 << 0x20),new_target_00,in_R9D,
                                in_stack_00000008,in_stack_00000010);
        return JVar6;
      }
      JVar6.tag = (int64_t)in_RSI.ptr;
      JVar6.u.ptr = ((JSValueUnion *)((long)in_RSI.ptr + 0x30))->ptr;
      JVar6 = js_create_from_ctor(in_stack_ffffffffffffffa0,JVar6,in_stack_ffffffffffffff9c);
      iVar5 = JS_IsException(JVar6);
      if (iVar5 != 0) {
        local_18.ptr = (void *)(local_18 << 0x20);
        local_10 = 6;
        return _local_18;
      }
      func_obj_01.tag = in_RDX;
      func_obj_01.u.ptr = in_RSI.ptr;
      JVar7.tag._0_4_ = uVar8;
      JVar7.u.ptr = in_RCX.ptr;
      JVar7.tag._4_4_ = uVar9;
      uVar10 = in_stack_00000010;
      JVar7 = JS_CallInternal(in_RDI,func_obj_01,JVar6,JVar7,in_R9D,in_stack_00000008,
                              in_stack_00000010);
      if (((int)JVar7.tag != -1) && (iVar5 = JS_IsException(JVar7), iVar5 == 0)) {
        v_00.tag._0_4_ = uVar10;
        v_00.u.ptr = in_stack_00000008;
        v_00.tag._4_4_ = in_stack_ffffffffffffff44;
        JS_FreeValue((JSContext *)CONCAT44(uVar9,uVar8),v_00);
        return JVar6;
      }
      v.tag._0_4_ = uVar10;
      v.u.ptr = in_stack_00000008;
      v.tag._4_4_ = in_stack_ffffffffffffff44;
      JS_FreeValue((JSContext *)CONCAT44(uVar9,uVar8),v);
      return JVar7;
    }
    pJVar1 = in_RDI->rt->class_array[*(ushort *)((long)in_RSI.ptr + 6)].call;
    if (pJVar1 != (JSClassCall *)0x0) {
      JVar3.tag = in_RDX;
      JVar3.u.ptr = in_RSI.ptr;
      JVar2.tag = in_R8;
      JVar2.u.ptr = in_RCX.ptr;
      JVar6 = (*pJVar1)(in_RDI,JVar3,JVar2,in_R9D,in_stack_00000008,in_stack_00000010);
      return JVar6;
    }
  }
  JVar6 = JS_ThrowTypeError(in_RDI,"not a function");
  return JVar6;
}

Assistant:

static JSValue JS_CallConstructorInternal(JSContext *ctx,
                                          JSValueConst func_obj,
                                          JSValueConst new_target,
                                          int argc, JSValue *argv, int flags)
{
    JSObject *p;
    JSFunctionBytecode *b;

    if (js_poll_interrupts(ctx))
        return JS_EXCEPTION;
    flags |= JS_CALL_FLAG_CONSTRUCTOR;
    if (unlikely(JS_VALUE_GET_TAG(func_obj) != JS_TAG_OBJECT))
        goto not_a_function;
    p = JS_VALUE_GET_OBJ(func_obj);
    if (unlikely(!p->is_constructor))
        return JS_ThrowTypeError(ctx, "not a constructor");
    if (unlikely(p->class_id != JS_CLASS_BYTECODE_FUNCTION)) {
        JSClassCall *call_func;
        call_func = ctx->rt->class_array[p->class_id].call;
        if (!call_func) {
        not_a_function:
            return JS_ThrowTypeError(ctx, "not a function");
        }
        return call_func(ctx, func_obj, new_target, argc,
                         (JSValueConst *)argv, flags);
    }

    b = p->u.func.function_bytecode;
    if (b->is_derived_class_constructor) {
        return JS_CallInternal(ctx, func_obj, JS_UNDEFINED, new_target, argc, argv, flags);
    } else {
        JSValue obj, ret;
        /* legacy constructor behavior */
        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_OBJECT);
        if (JS_IsException(obj))
            return JS_EXCEPTION;
        ret = JS_CallInternal(ctx, func_obj, obj, new_target, argc, argv, flags);
        if (JS_VALUE_GET_TAG(ret) == JS_TAG_OBJECT ||
            JS_IsException(ret)) {
            JS_FreeValue(ctx, obj);
            return ret;
        } else {
            JS_FreeValue(ctx, ret);
            return obj;
        }
    }
}